

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O1

void yv12_copy_plane(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int plane)

{
  if (plane == 2) {
    aom_yv12_copy_v_c(src_bc,dst_bc,0);
    return;
  }
  if (plane == 1) {
    aom_yv12_copy_u_c(src_bc,dst_bc,0);
    return;
  }
  aom_yv12_copy_y_c(src_bc,dst_bc,0);
  return;
}

Assistant:

static void yv12_copy_plane(const YV12_BUFFER_CONFIG *src_bc,
                            YV12_BUFFER_CONFIG *dst_bc, int plane) {
  switch (plane) {
    case 0: aom_yv12_copy_y(src_bc, dst_bc, 0); break;
    case 1: aom_yv12_copy_u(src_bc, dst_bc, 0); break;
    case 2: aom_yv12_copy_v(src_bc, dst_bc, 0); break;
    default: assert(plane >= 0 && plane <= 2); break;
  }
}